

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_nodeproj.cc
# Opt level: O3

RC __thiscall QL_NodeProj::PrintNode(QL_NodeProj *this,int numTabs)

{
  size_t sVar1;
  int iVar2;
  long lVar3;
  AttrCatEntry *pAVar4;
  char *__s;
  
  iVar2 = numTabs;
  if (0 < numTabs) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--PROJ: \n",9);
  if (0 < (this->super_QL_Node).attrsInRecSize) {
    lVar3 = 0;
    do {
      iVar2 = (this->super_QL_Node).attrsInRec[lVar3];
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      pAVar4 = ((this->super_QL_Node).qlm)->attrEntries;
      if (pAVar4 == (AttrCatEntry *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x12b1d0);
      }
      else {
        pAVar4 = pAVar4 + iVar2;
        sVar1 = strlen(pAVar4->relName);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,pAVar4->relName,sVar1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,".",1);
      __s = ((this->super_QL_Node).qlm)->attrEntries[iVar2].attrName;
      sVar1 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar1);
      lVar3 = lVar3 + 1;
    } while (lVar3 < (this->super_QL_Node).attrsInRecSize);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  (*this->prevNode->_vptr_QL_Node[5])(this->prevNode,(ulong)(numTabs + 1));
  return 0;
}

Assistant:

RC QL_NodeProj::PrintNode(int numTabs){
  for(int i=0; i < numTabs; i++){
    cout << "\t";
  }
  cout << "--PROJ: \n";
  for(int i = 0; i < attrsInRecSize; i++){
    int index = attrsInRec[i];
    cout << " " << qlm.attrEntries[index].relName << "." << qlm.attrEntries[index].attrName;
  }
  cout << "\n";
  prevNode.PrintNode(numTabs + 1);

  return (0);
}